

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrReferenceSpaceType value)

{
  bool bVar1;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_188;
  allocator local_169;
  string local_168 [8];
  string error_str_2;
  allocator local_141;
  string local_140 [8];
  string vuid_2;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_120;
  allocator local_101;
  string local_100 [8];
  string error_str_1;
  allocator local_d9;
  string local_d8 [8];
  string vuid_1;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_b8;
  allocator local_99;
  string local_98 [8];
  string error_str;
  allocator local_61;
  string local_60 [8];
  string vuid;
  XrReferenceSpaceType value_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *item_name_local;
  string *validation_name_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  if (value == XR_REFERENCE_SPACE_TYPE_VIEW) {
    instance_info_local._7_1_ = true;
  }
  else if (value == XR_REFERENCE_SPACE_TYPE_LOCAL) {
    instance_info_local._7_1_ = true;
  }
  else if (value == XR_REFERENCE_SPACE_TYPE_STAGE) {
    instance_info_local._7_1_ = true;
  }
  else if (value == XR_REFERENCE_SPACE_TYPE_UNBOUNDED_MSFT) {
    if ((instance_info != (GenValidUsageXrInstanceInfo *)0x0) &&
       (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,
                                 "XR_MSFT_unbounded_reference_space"), !bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"VUID-",&local_61);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      std::__cxx11::string::operator+=(local_60,(string *)validation_name);
      std::__cxx11::string::operator+=(local_60,"-");
      std::__cxx11::string::operator+=(local_60,(string *)item_name);
      std::__cxx11::string::operator+=(local_60,"-parameter");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_98,"XrReferenceSpaceType value \"XR_REFERENCE_SPACE_TYPE_UNBOUNDED_MSFT\"",
                 &local_99);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      std::__cxx11::string::operator+=(local_98," being used, which requires extension ");
      std::__cxx11::string::operator+=
                (local_98,
                 " \"XR_MSFT_unbounded_reference_space\" to be enabled, but it is not enabled");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_b8,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_60,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_b8,(string *)local_98);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_b8);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_60);
      return false;
    }
    instance_info_local._7_1_ = true;
  }
  else if (value == XR_REFERENCE_SPACE_TYPE_COMBINED_EYE_VARJO) {
    if ((instance_info != (GenValidUsageXrInstanceInfo *)0x0) &&
       (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_VARJO_foveated_rendering"),
       !bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,"VUID-",&local_d9);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      std::__cxx11::string::operator+=(local_d8,(string *)validation_name);
      std::__cxx11::string::operator+=(local_d8,"-");
      std::__cxx11::string::operator+=(local_d8,(string *)item_name);
      std::__cxx11::string::operator+=(local_d8,"-parameter");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,
                 "XrReferenceSpaceType value \"XR_REFERENCE_SPACE_TYPE_COMBINED_EYE_VARJO\"",
                 &local_101);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::__cxx11::string::operator+=(local_100," being used, which requires extension ");
      std::__cxx11::string::operator+=
                (local_100," \"XR_VARJO_foveated_rendering\" to be enabled, but it is not enabled");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_120,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_120,(string *)local_100);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_120);
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::~string(local_d8);
      return false;
    }
    instance_info_local._7_1_ = true;
  }
  else if (value == XR_REFERENCE_SPACE_TYPE_LOCALIZATION_MAP_ML) {
    if ((instance_info != (GenValidUsageXrInstanceInfo *)0x0) &&
       (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_ML_localization_map"),
       !bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_140,"VUID-",&local_141);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
      std::__cxx11::string::operator+=(local_140,(string *)validation_name);
      std::__cxx11::string::operator+=(local_140,"-");
      std::__cxx11::string::operator+=(local_140,(string *)item_name);
      std::__cxx11::string::operator+=(local_140,"-parameter");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_168,
                 "XrReferenceSpaceType value \"XR_REFERENCE_SPACE_TYPE_LOCALIZATION_MAP_ML\"",
                 &local_169);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
      std::__cxx11::string::operator+=(local_168," being used, which requires extension ");
      std::__cxx11::string::operator+=
                (local_168," \"XR_ML_localization_map\" to be enabled, but it is not enabled");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_188,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_140,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_188,(string *)local_168);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_188);
      std::__cxx11::string::~string(local_168);
      std::__cxx11::string::~string(local_140);
      return false;
    }
    instance_info_local._7_1_ = true;
  }
  else if (value == XR_REFERENCE_SPACE_TYPE_LOCAL_FLOOR) {
    instance_info_local._7_1_ = true;
  }
  else {
    instance_info_local._7_1_ = false;
  }
  return instance_info_local._7_1_;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrReferenceSpaceType value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    switch (value) {
        case XR_REFERENCE_SPACE_TYPE_VIEW:
            return true;
        case XR_REFERENCE_SPACE_TYPE_LOCAL:
            return true;
        case XR_REFERENCE_SPACE_TYPE_STAGE:
            return true;
        case XR_REFERENCE_SPACE_TYPE_LOCAL_FLOOR:
            return true;
        case XR_REFERENCE_SPACE_TYPE_UNBOUNDED_MSFT:
            // Enum value XR_REFERENCE_SPACE_TYPE_UNBOUNDED_MSFT requires extension XR_MSFT_unbounded_reference_space, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_MSFT_unbounded_reference_space")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrReferenceSpaceType value \"XR_REFERENCE_SPACE_TYPE_UNBOUNDED_MSFT\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_MSFT_unbounded_reference_space\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
        case XR_REFERENCE_SPACE_TYPE_COMBINED_EYE_VARJO:
            // Enum value XR_REFERENCE_SPACE_TYPE_COMBINED_EYE_VARJO requires extension XR_VARJO_foveated_rendering, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_VARJO_foveated_rendering")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrReferenceSpaceType value \"XR_REFERENCE_SPACE_TYPE_COMBINED_EYE_VARJO\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_VARJO_foveated_rendering\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
        case XR_REFERENCE_SPACE_TYPE_LOCALIZATION_MAP_ML:
            // Enum value XR_REFERENCE_SPACE_TYPE_LOCALIZATION_MAP_ML requires extension XR_ML_localization_map, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_ML_localization_map")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrReferenceSpaceType value \"XR_REFERENCE_SPACE_TYPE_LOCALIZATION_MAP_ML\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_ML_localization_map\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
    default:
        return false;
}
}